

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::FenceVkImpl::AddPendingSyncPoint
          (FenceVkImpl *this,SoftwareQueueIndex CommandQueueId,Uint64 Value,
          SyncPointVkPtr *SyncPoint)

{
  bool bVar1;
  reference pvVar2;
  Char *pCVar3;
  element_type *peVar4;
  size_type sVar5;
  char (*in_stack_fffffffffffffea8) [117];
  deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
  *this_00;
  SyncPointVkPtr *local_148;
  value_type local_108;
  uchar local_e9;
  undefined1 local_e8 [8];
  string msg_3;
  undefined1 local_c0 [8];
  string msg_2;
  Uint64 LastValue;
  lock_guard<std::mutex> Lock;
  string msg_1;
  undefined1 local_60 [8];
  string msg;
  SyncPointVkPtr *SyncPoint_local;
  Uint64 Value_local;
  FenceVkImpl *this_local;
  SyncPointVkPtr *pSStack_20;
  SoftwareQueueIndex CommandQueueId_local;
  memory_order __b;
  
  msg.field_2._8_8_ = SyncPoint;
  SyncPoint_local = (SyncPointVkPtr *)Value;
  Value_local = (Uint64)this;
  this_local._7_1_ = CommandQueueId.m_Value;
  bVar1 = IsTimelineSemaphore(this);
  if (bVar1) {
    FormatString<char[46]>
              ((string *)local_60,(char (*) [46])"Not supported when timeline semaphore is used");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AddPendingSyncPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x116);
    std::__cxx11::string::~string((string *)local_60);
  }
  else {
    bVar1 = std::operator==(SyncPoint,(nullptr_t)0x0);
    if (bVar1) {
      FormatString<char[18]>((string *)&Lock,(char (*) [18])"SyncPoint is null");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"AddPendingSyncPoint",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x11b);
      std::__cxx11::string::~string((string *)&Lock);
    }
    else {
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&this->super_FenceBase<Diligent::EngineVkImplTraits>,(Uint64)SyncPoint_local);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&LastValue,&this->m_SyncPointsGuard);
      bVar1 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::empty(&this->m_SyncPoints);
      if (bVar1) {
        std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_148 = (SyncPointVkPtr *)
                    (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
                    super___atomic_base<unsigned_long>._M_i;
        pSStack_20 = local_148;
      }
      else {
        pvVar2 = std::
                 deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ::back(&this->m_SyncPoints);
        local_148 = (SyncPointVkPtr *)pvVar2->Value;
      }
      msg_2.field_2._8_8_ = local_148;
      if (SyncPoint_local <= local_148) {
        FormatString<char[12],unsigned_long,char[40],unsigned_long,char[2]>
                  ((string *)local_c0,(Diligent *)"New value (",(char (*) [12])&SyncPoint_local,
                   (unsigned_long *)") must be greater than previous value (",
                   (char (*) [40])((long)&msg_2.field_2 + 8),(unsigned_long *)0xcabce5,
                   (char (*) [2])in_stack_fffffffffffffea8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"AddPendingSyncPoint",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                   ,0x127);
        std::__cxx11::string::~string((string *)local_c0);
      }
      bVar1 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::empty(&this->m_SyncPoints);
      if (!bVar1) {
        pvVar2 = std::
                 deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ::back(&this->m_SyncPoints);
        peVar4 = std::
                 __shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&pvVar2->SyncPoint);
        msg_3.field_2._M_local_buf[0xf] = (char)SyncPointVk::GetCommandQueueId(peVar4);
        bVar1 = IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag>::operator==
                          ((IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                           (msg_3.field_2._M_local_buf + 0xf),
                           (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                           ((long)&this_local + 7));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar2 = std::
                   deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                   ::back(&this->m_SyncPoints);
          peVar4 = std::
                   __shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&pvVar2->SyncPoint);
          local_e9 = (uchar)SyncPointVk::GetCommandQueueId(peVar4);
          FormatString<char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
                    ((string *)local_e8,
                     (Diligent *)"Fence enqueued for signal operation in command queue ",
                     (char (*) [54])((long)&this_local + 7),
                     (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                     ", but previous signal operation was in command queue ",
                     (char (*) [54])&local_e9,
                     (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                     ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed."
                     ,in_stack_fffffffffffffea8);
          pCVar3 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar3,"AddPendingSyncPoint",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                     ,0x12e);
          std::__cxx11::string::~string((string *)local_e8);
        }
      }
      sVar5 = std::
              deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
              ::size(&this->m_SyncPoints);
      if (8 < sVar5) {
        InternalGetCompletedValue(this);
      }
      this_00 = &this->m_SyncPoints;
      local_108.Value = (Uint64)SyncPoint_local;
      std::shared_ptr<Diligent::SyncPointVk>::shared_ptr(&local_108.SyncPoint,SyncPoint);
      std::
      deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
      ::push_back(this_00,&local_108);
      SyncPointData::~SyncPointData(&local_108);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&LastValue);
    }
  }
  return;
}

Assistant:

void FenceVkImpl::AddPendingSyncPoint(SoftwareQueueIndex CommandQueueId, Uint64 Value, SyncPointVkPtr SyncPoint)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Not supported when timeline semaphore is used");
        return;
    }
    if (SyncPoint == nullptr)
    {
        UNEXPECTED("SyncPoint is null");
        return;
    }

    DvpSignal(Value);

    std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

#ifdef DILIGENT_DEVELOPMENT
    {
        const Uint64 LastValue = m_SyncPoints.empty() ? m_LastCompletedFenceValue.load() : m_SyncPoints.back().Value;
        DEV_CHECK_ERR(Value > LastValue,
                      "New value (", Value, ") must be greater than previous value (", LastValue, ")");
    }
    if (!m_SyncPoints.empty())
    {
        DEV_CHECK_ERR(m_SyncPoints.back().SyncPoint->GetCommandQueueId() == CommandQueueId,
                      "Fence enqueued for signal operation in command queue ", CommandQueueId,
                      ", but previous signal operation was in command queue ", m_SyncPoints.back().SyncPoint->GetCommandQueueId(),
                      ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed.");
    }
#endif

    // If IFence is used only for synchronization between queues it will accumulate many more sync points.
    // We need to check VkFence and remove already reached sync points.
    if (m_SyncPoints.size() > RequiredArraySize)
    {
        InternalGetCompletedValue();
    }

    m_SyncPoints.push_back({Value, std::move(SyncPoint)});
}